

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::wheelEvent(QGraphicsProxyWidget *this,QGraphicsSceneWheelEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  bool bVar1;
  uint uVar2;
  ScrollPhase SVar3;
  Orientation OVar4;
  MouseButtons MVar5;
  KeyboardModifiers KVar6;
  ulong uVar7;
  QWidget *pQVar8;
  Data *pDVar9;
  QPoint QVar10;
  undefined8 uVar11;
  int *piVar12;
  int *piVar13;
  QWidget *pQVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QArrayData *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  double local_d8;
  double local_d0;
  QWheelEvent wheelEvent;
  QWeakPointer<QObject> local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar9 = (this_00->widget).wp.d;
  if (((pDVar9 == (Data *)0x0) || (*(int *)(pDVar9 + 4) == 0)) ||
     ((this_00->widget).wp.value == (QObject *)0x0)) goto LAB_006099e0;
  local_48.yp._0_4_ = 0xffffffff;
  local_48.xp = -NAN;
  local_48.yp._4_4_ = 0xffffffff;
  local_48 = QGraphicsSceneWheelEvent::pos(event);
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  auVar16 = _DAT_0066f5b0 & (undefined1  [16])local_48 | _DAT_0066f5c0;
  auVar17._0_8_ = auVar16._0_8_ + local_48.xp;
  auVar17._8_8_ = auVar16._8_8_ + local_48.yp;
  auVar16 = minpd(_DAT_0066f5d0,auVar17);
  auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
  auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
  uVar2 = movmskpd(*(undefined4 *)((this_00->widget).wp.d + 4),auVar18);
  uVar15 = 0x8000000000000000;
  if ((uVar2 & 2) != 0) {
    uVar15 = (ulong)(uint)(int)auVar16._8_8_ << 0x20;
  }
  uVar7 = 0x80000000;
  if ((uVar2 & 1) != 0) {
    uVar7 = (ulong)(uint)(int)auVar16._0_8_;
  }
  _wheelEvent = (QPoint)(uVar7 | uVar15);
  pQVar8 = QWidget::childAt((QWidget *)(this_00->widget).wp.value,(QPoint *)&wheelEvent);
  if (pQVar8 == (QWidget *)0x0) {
    pDVar9 = (Data *)0x0;
  }
  else {
    pDVar9 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
  }
  if (((pDVar9 == (Data *)0x0) || (pQVar8 == (QWidget *)0x0)) ||
     (local_58.d = pDVar9, local_58.value = &pQVar8->super_QObject, *(int *)(pDVar9 + 4) == 0)) {
    local_58.d = (this_00->widget).wp.d;
    local_58.value = (this_00->widget).wp.value;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      *(int *)local_58.d = *(int *)local_58.d + 1;
      UNLOCK();
    }
    if (pDVar9 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar9 = *(int *)pDVar9 + -1;
      UNLOCK();
      if (*(int *)pDVar9 == 0) {
        operator_delete(pDVar9);
      }
    }
  }
  pDVar9 = QApplicationPrivate::wheel_widget.wp.d;
  if (QApplicationPrivate::wheel_widget.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)QApplicationPrivate::wheel_widget.wp.d =
         *(int *)QApplicationPrivate::wheel_widget.wp.d + 1;
    UNLOCK();
  }
  SVar3 = QGraphicsSceneWheelEvent::phase(event);
  if (SVar3 == ScrollBegin) {
    QWeakPointer<QObject>::operator=(&QApplicationPrivate::wheel_widget.wp,&local_58);
LAB_00609757:
    if ((local_58.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    local_48 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_48,pQVar8);
    OVar4 = QGraphicsSceneWheelEvent::orientation(event);
    uVar2 = QGraphicsSceneWheelEvent::delta(event);
    uVar15 = (ulong)uVar2 << 0x20;
    if (OVar4 == Horizontal) {
      uVar15 = (ulong)uVar2;
    }
    _wheelEvent = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QVar10 = QGraphicsSceneWheelEvent::screenPos(event);
    local_d8 = (double)QVar10.xp.m_i.m_i;
    local_d0 = (double)QVar10.yp.m_i.m_i;
    QVar10 = QGraphicsSceneWheelEvent::pixelDelta(event);
    MVar5 = QGraphicsSceneWheelEvent::buttons(event);
    KVar6 = QGraphicsSceneWheelEvent::modifiers(event);
    SVar3 = QGraphicsSceneWheelEvent::phase(event);
    bVar1 = QGraphicsSceneWheelEvent::isInverted(event);
    local_f8 = (QArrayData *)0x0;
    uStack_f0 = 0;
    local_e8 = 0;
    uVar11 = QPointingDevice::primaryPointingDevice((QString *)&local_f8);
    QWheelEvent::QWheelEvent
              (&wheelEvent,&local_48,&local_d8,QVar10,uVar15,
               MVar5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i,
               KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i,SVar3,bVar1,2,uVar11);
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,2,0x10);
      }
    }
    pQVar8 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
    if (pQVar8 == (QWidget *)0x0) {
      piVar12 = (int *)0x0;
    }
    else {
      piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
    }
    if ((local_58.d == (Data *)0x0) ||
       (pQVar14 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    qt_sendSpontaneousEvent(&pQVar14->super_QObject,(QEvent *)&wheelEvent);
    (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,0xaa);
    QGraphicsSceneWheelEvent::phase(event);
    if ((((piVar12 != (int *)0x0) && (pQVar8 != (QWidget *)0x0)) && (piVar12[1] != 0)) &&
       (bVar1 = QWidget::hasFocus(pQVar8), !bVar1)) {
      QWidget::update(pQVar8);
      pQVar8 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
      if (pQVar8 == (QWidget *)0x0) {
        piVar13 = (int *)0x0;
      }
      else {
        piVar13 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
      }
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          operator_delete(piVar12);
        }
      }
      piVar12 = piVar13;
      if (((piVar13 != (int *)0x0) && (pQVar8 != (QWidget *)0x0)) &&
         ((piVar13[1] != 0 && (bVar1 = QWidget::hasFocus(pQVar8), bVar1)))) {
        QWidget::update(pQVar8);
      }
    }
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        operator_delete(piVar12);
      }
    }
    QWheelEvent::~QWheelEvent(&wheelEvent);
  }
  else {
    SVar3 = QGraphicsSceneWheelEvent::phase(event);
    if (SVar3 == NoScrollPhase) goto LAB_00609757;
    if ((QApplicationPrivate::wheel_widget.wp.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)QApplicationPrivate::wheel_widget.wp.value,
       *(int *)(QApplicationPrivate::wheel_widget.wp.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    if ((local_58.d == (Data *)0x0) ||
       (pQVar14 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    if (pQVar8 == pQVar14) goto LAB_00609757;
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  if (pDVar9 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar9 = *(int *)pDVar9 + -1;
    UNLOCK();
    if ((*(int *)pDVar9 == 0) && (pDVar9 != (Data *)0x0)) {
      operator_delete(pDVar9);
    }
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    *(int *)local_58.d = *(int *)local_58.d + -1;
    UNLOCK();
    if ((*(int *)local_58.d == 0) && (local_58.d != (Data *)0x0)) {
      operator_delete(local_58.d);
    }
  }
LAB_006099e0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::wheelEvent(QGraphicsSceneWheelEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::wheelEvent");
#endif
    if (!d->widget)
        return;

    QPointF pos = event->pos();
    QPointer<QWidget> receiver = d->widget->childAt(pos.toPoint());
    if (!receiver)
        receiver = d->widget;

    // high precision event streams go to the grabber, which will be the
    // QGraphicsView's viewport. We need to change that temporarily, otherwise
    // the event we send to the receiver get grabbed by the viewport, resulting
    // in infinite recursion
    QPointer<QWidget> prev_grabber = QApplicationPrivate::wheel_widget;
    if (event->phase() == Qt::ScrollBegin) {
        QApplicationPrivate::wheel_widget = receiver;
    } else if (event->phase() != Qt::NoScrollPhase && QApplicationPrivate::wheel_widget != receiver) {
        // this event is part of a stream that didn't start here, so ignore
        event->ignore();
        return;
    }

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    // Send mouse event.
    QPoint angleDelta;
    if (event->orientation() == Qt::Horizontal)
        angleDelta.setX(event->delta());
    else
        angleDelta.setY(event->delta());
    // pixelDelta, inverted, scrollPhase and source from the original QWheelEvent
    // were not preserved in the QGraphicsSceneWheelEvent unfortunately
    QWheelEvent wheelEvent(pos, event->screenPos(), event->pixelDelta(), angleDelta,
                           event->buttons(), event->modifiers(), event->phase(),
                           event->isInverted(), Qt::MouseEventSynthesizedByQt,
                           QPointingDevice::primaryPointingDevice());
    QPointer<QWidget> focusWidget = d->widget->focusWidget();
    extern bool qt_sendSpontaneousEvent(QObject *, QEvent *);
    qt_sendSpontaneousEvent(receiver, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());

    if (event->phase() == Qt::ScrollBegin) {
        // reset the wheel grabber if the event wasn't accepted
        if (!wheelEvent.isAccepted())
            QApplicationPrivate::wheel_widget = prev_grabber;
    }

    // ### Remove, this should be done by proper focusIn/focusOut events.
    if (focusWidget && !focusWidget->hasFocus()) {
        focusWidget->update();
        focusWidget = d->widget->focusWidget();
        if (focusWidget && focusWidget->hasFocus())
            focusWidget->update();
    }
}